

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ruby_generator.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::ruby::LabelForField_abi_cxx11_
          (string *__return_storage_ptr__,ruby *this,FieldDescriptor *field)

{
  Label LVar1;
  allocator<char> local_2e;
  allocator<char> local_2d [20];
  allocator<char> local_19;
  ruby *local_18;
  FieldDescriptor *field_local;
  
  local_18 = this;
  field_local = (FieldDescriptor *)__return_storage_ptr__;
  LVar1 = FieldDescriptor::label((FieldDescriptor *)this);
  if (LVar1 == LABEL_OPTIONAL) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"optional",&local_19);
    std::allocator<char>::~allocator(&local_19);
  }
  else if (LVar1 == LABEL_REQUIRED) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"required",local_2d);
    std::allocator<char>::~allocator(local_2d);
  }
  else {
    if (LVar1 != LABEL_REPEATED) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/compiler/ruby/ruby_generator.cc"
                    ,0x57,
                    "std::string google::protobuf::compiler::ruby::LabelForField(const google::protobuf::FieldDescriptor *)"
                   );
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"repeated",&local_2e);
    std::allocator<char>::~allocator(&local_2e);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string LabelForField(const google::protobuf::FieldDescriptor* field) {
  switch (field->label()) {
    case FieldDescriptor::LABEL_OPTIONAL: return "optional";
    case FieldDescriptor::LABEL_REQUIRED: return "required";
    case FieldDescriptor::LABEL_REPEATED: return "repeated";
    default: assert(false); return "";
  }
}